

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  cmFileLockPool *pcVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  bool bVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  long *plVar8;
  ScopePool *pSVar9;
  
  for (pcVar1 = (cmFileLockPool *)
                (this->FunctionScopes).
                super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl._M_node.super__List_node_base._M_next; pcVar1 != this;
      pcVar1 = (cmFileLockPool *)
               (pcVar1->FunctionScopes).
               super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
               ._M_impl._M_node.super__List_node_base._M_next) {
    plVar2 = (long *)(pcVar1->FunctionScopes).
                     super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                     ._M_impl._M_node._M_size;
    plVar8 = plVar2;
    while (plVar8 = (long *)*plVar8, plVar8 != plVar2) {
      bVar4 = cmFileLock::IsLocked((cmFileLock *)plVar8[2],filename);
      if (bVar4) {
        return true;
      }
    }
  }
  p_Var7 = (this->FileScopes).
           super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var7 == (_List_node_base *)&this->FileScopes) {
      pSVar9 = &this->ProcessScope;
      p_Var7 = (_List_node_base *)pSVar9;
      do {
        p_Var7 = (((List *)&p_Var7->_M_next)->
                 super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>)._M_impl._M_node.
                 super__List_node_base._M_next;
        bVar4 = p_Var7 != (_List_node_base *)pSVar9;
        if (p_Var7 == (_List_node_base *)pSVar9) {
          return bVar4;
        }
        bVar5 = cmFileLock::IsLocked(*(cmFileLock **)(p_Var7 + 1),filename);
      } while (!bVar5);
      return bVar4;
    }
    p_Var3 = p_Var7[1]._M_next;
    p_Var6 = p_Var3;
    while (p_Var6 = p_Var6->_M_next, p_Var6 != p_Var3) {
      bVar4 = cmFileLock::IsLocked((cmFileLock *)p_Var6[1]._M_next,filename);
      if (bVar4) {
        return true;
      }
    }
    p_Var7 = p_Var7->_M_next;
  } while( true );
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (CIt i = this->FunctionScopes.begin();
      i != this->FunctionScopes.end(); ++i)
    {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result)
      {
      return true;
      }
    }

  for (CIt i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i)
    {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result)
      {
      return true;
      }
    }

  return this->ProcessScope.IsAlreadyLocked(filename);
}